

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void countFinalize(sqlite3_context *context)

{
  i64 *piVar1;
  i64 iVal;
  
  iVal = 0;
  piVar1 = (i64 *)sqlite3_aggregate_context(context,0);
  if (piVar1 != (i64 *)0x0) {
    iVal = *piVar1;
  }
  sqlite3_result_int64(context,iVal);
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}